

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::LogicalAndExp(SQCompiler *this)

{
  SQCompiler *this_00;
  SQCompiler *pSVar1;
  SQFuncState *this_01;
  SQCompiler *in_RDI;
  SQInteger second_exp;
  SQInteger jpos;
  SQInteger trg;
  SQInteger first_exp;
  SQCompiler *in_stack_ffffffffffffffb0;
  SQFuncState *in_stack_ffffffffffffffb8;
  SQCompiler *in_stack_ffffffffffffffc8;
  code *in_stack_ffffffffffffffd0;
  SQInteger in_stack_ffffffffffffffd8;
  SQOpcode _op;
  SQFuncState *in_stack_ffffffffffffffe0;
  
  BitwiseOrExp(in_RDI);
  while (_op = (SQOpcode)((ulong)in_stack_ffffffffffffffd8 >> 0x20), in_RDI->_token == 0x10e) {
    this_00 = (SQCompiler *)SQFuncState::PopTarget((SQFuncState *)in_RDI);
    pSVar1 = (SQCompiler *)
             SQFuncState::PushTarget(in_stack_ffffffffffffffb8,(SQInteger)in_stack_ffffffffffffffb0)
    ;
    SQFuncState::AddInstruction
              (in_stack_ffffffffffffffe0,_op,(SQInteger)in_stack_ffffffffffffffd0,
               (SQInteger)in_stack_ffffffffffffffc8,(SQInteger)in_RDI,
               (SQInteger)in_stack_ffffffffffffffb8);
    this_01 = (SQFuncState *)SQFuncState::GetCurrentPos((SQFuncState *)0x12a4c4);
    if (pSVar1 != this_00) {
      SQFuncState::AddInstruction
                (this_01,_op,(SQInteger)in_stack_ffffffffffffffd0,
                 (SQInteger)in_stack_ffffffffffffffc8,(SQInteger)in_RDI,
                 (SQInteger)in_stack_ffffffffffffffb8);
    }
    Lex(in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffd0 = LogicalAndExp;
    in_stack_ffffffffffffffd8 = 0;
    INVOKE_EXP<void(SQCompiler::*)()>(this_00,(offset_in_SQCompiler_to_subr)this_01);
    SQFuncState::SnoozeOpt(in_RDI->_fs);
    in_stack_ffffffffffffffc8 = (SQCompiler *)SQFuncState::PopTarget((SQFuncState *)in_RDI);
    if (pSVar1 != in_stack_ffffffffffffffc8) {
      SQFuncState::AddInstruction
                (this_01,(SQOpcode)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                 (SQInteger)in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8,
                 (SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffffb8);
    }
    in_stack_ffffffffffffffb8 = this_01;
    SQFuncState::SnoozeOpt(in_RDI->_fs);
    in_stack_ffffffffffffffb0 = (SQCompiler *)in_RDI->_fs;
    in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffb8;
    SQFuncState::GetCurrentPos((SQFuncState *)0x12a5ae);
    SQFuncState::SetIntructionParam
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (SQInteger)in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void LogicalAndExp()
    {
        BitwiseOrExp();
        for(;;) switch(_token) {
        case TK_AND: {
            SQInteger first_exp = _fs->PopTarget();
            SQInteger trg = _fs->PushTarget();
            _fs->AddInstruction(_OP_AND, trg, 0, first_exp, 0);
            SQInteger jpos = _fs->GetCurrentPos();
            if(trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
            Lex(); INVOKE_EXP(&SQCompiler::LogicalAndExp);
            _fs->SnoozeOpt();
            SQInteger second_exp = _fs->PopTarget();
            if(trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);
            _fs->SnoozeOpt();
            _fs->SetIntructionParam(jpos, 1, (_fs->GetCurrentPos() - jpos));
            break;
            }

        default:
            return;
        }
    }